

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall double_conversion::Bignum::AddUInt64(Bignum *this,uint64_t operand)

{
  Bignum other;
  Bignum local_214;
  
  if (operand != 0) {
    local_214.used_bigits_ = 0;
    local_214.exponent_ = 0;
    AssignUInt64(&local_214,operand);
    AddBignum(this,&local_214);
  }
  return;
}

Assistant:

void Bignum::AddUInt64(const uint64_t operand) {
  if (operand == 0) {
    return;
  }
  Bignum other;
  other.AssignUInt64(operand);
  AddBignum(other);
}